

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O1

uint32_t units::getCommodity(string *comm)

{
  char *pcVar1;
  size_t __n;
  pointer pcVar2;
  char *pcVar3;
  int iVar4;
  void *pvVar5;
  iterator iVar6;
  const_iterator cVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  uint32_t code;
  string *__range1;
  char *pcVar11;
  char *pcVar12;
  char cVar13;
  long lVar14;
  size_type sVar15;
  uint32_t uVar16;
  ulong uVar17;
  ulong uVar18;
  size_type sVar19;
  string *comm_00;
  long *local_48 [2];
  long local_38 [2];
  
  __n = comm->_M_string_length;
  if (__n == 0) {
    uVar17 = 0xffffffffffffffff;
  }
  else {
    pcVar2 = (comm->_M_dataplus)._M_p;
    pvVar5 = memchr(pcVar2,0x5c,__n);
    uVar17 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)pcVar2;
  }
  if (uVar17 < __n - 1) {
    do {
      bVar8 = (comm->_M_dataplus)._M_p[uVar17 + 1];
      uVar9 = bVar8 - 0x5b;
      if (((uVar9 < 0x23) && ((0x500000007U >> ((ulong)uVar9 & 0x3f) & 1) != 0)) ||
         (bVar8 - 0x28 < 2)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)comm,uVar17,
                   1);
      }
      uVar18 = uVar17 + 1;
      uVar10 = comm->_M_string_length;
      uVar17 = 0xffffffffffffffff;
      if (uVar18 <= uVar10 && uVar10 - uVar18 != 0) {
        pcVar2 = (comm->_M_dataplus)._M_p;
        pvVar5 = memchr(pcVar2 + uVar18,0x5c,uVar10 - uVar18);
        uVar17 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)pcVar2;
      }
    } while (uVar17 < uVar10 - 1);
  }
  sVar19 = comm->_M_string_length;
  if (sVar19 != 0) {
    pcVar2 = (comm->_M_dataplus)._M_p;
    sVar15 = 0;
    do {
      iVar4 = tolower((int)pcVar2[sVar15]);
      pcVar2[sVar15] = (char)iVar4;
      sVar15 = sVar15 + 1;
    } while (sVar19 != sVar15);
  }
  if (((_ZN5unitsL22allowCustomCommoditiesE_0 & 1) != 0) &&
     (customCommodityCodes_abi_cxx11_._24_8_ != 0)) {
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)customCommodityCodes_abi_cxx11_,comm);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
        ._M_cur != (__node_type *)0x0) {
      sVar19 = (size_type)
               *(uint *)((long)iVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                               ._M_cur + 0x28);
    }
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
        ._M_cur != (__node_type *)0x0) {
      return (uint32_t)sVar19;
    }
  }
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)commodities::commodity_codes_abi_cxx11_,comm);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(uint32_t *)
            ((long)cVar7.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                   ._M_cur + 0x28);
  }
  iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)comm,0,7,
                  "cxcomm[");
  if (iVar4 == 0) {
    uVar17 = strtoul((comm->_M_dataplus)._M_p + 7,(char **)0x0,0);
    return (uint32_t)uVar17;
  }
  uVar17 = comm->_M_string_length;
  if (5 < uVar17) goto LAB_003c5d83;
  pcVar3 = (comm->_M_dataplus)._M_p;
  pcVar1 = pcVar3 + uVar17;
  pcVar11 = pcVar3;
  if (3 < uVar17) {
    pcVar11 = pcVar3 + ((uint)uVar17 & 4);
    lVar14 = (uVar17 >> 2) + 1;
    pcVar12 = pcVar3 + 3;
    do {
      if (pcVar12[-3] != ' ' && (byte)(pcVar12[-3] + 0x82U) < 0xe1) {
        pcVar12 = pcVar12 + -3;
        goto LAB_003c5d7a;
      }
      if (pcVar12[-2] != ' ' && (byte)(pcVar12[-2] + 0x82U) < 0xe1) {
        pcVar12 = pcVar12 + -2;
        goto LAB_003c5d7a;
      }
      if (pcVar12[-1] != ' ' && (byte)(pcVar12[-1] + 0x82U) < 0xe1) {
        pcVar12 = pcVar12 + -1;
        goto LAB_003c5d7a;
      }
      if (*pcVar12 != ' ' && (byte)(*pcVar12 + 0x82U) < 0xe1) goto LAB_003c5d7a;
      lVar14 = lVar14 + -1;
      pcVar12 = pcVar12 + 4;
    } while (1 < lVar14);
  }
  lVar14 = (long)pcVar1 - (long)pcVar11;
  if (lVar14 == 1) {
LAB_003c5d60:
    pcVar12 = pcVar11;
    if (0xe0 < (byte)(*pcVar11 + 0x82U)) {
      pcVar12 = pcVar1;
    }
    if (*pcVar11 == ' ') {
      pcVar12 = pcVar1;
    }
  }
  else if (lVar14 == 2) {
LAB_003c5d41:
    pcVar12 = pcVar11;
    if (*pcVar11 == ' ' || 0xe0 < (byte)(*pcVar11 + 0x82U)) {
      pcVar11 = pcVar11 + 1;
      goto LAB_003c5d60;
    }
  }
  else {
    pcVar12 = pcVar1;
    if ((lVar14 == 3) && (pcVar12 = pcVar11, *pcVar11 == ' ' || 0xe0 < (byte)(*pcVar11 + 0x82U))) {
      pcVar11 = pcVar11 + 1;
      goto LAB_003c5d41;
    }
  }
LAB_003c5d7a:
  if (pcVar12 == pcVar1) {
    if (uVar17 != 0) {
      uVar16 = 0x40000000;
      uVar10 = 0;
      bVar8 = 0;
      do {
        cVar13 = pcVar3[uVar10] + -0x5f;
        if (pcVar3[uVar10] == ' ') {
          cVar13 = '\0';
        }
        uVar16 = uVar16 + ((int)cVar13 << (bVar8 & 0x1f));
        bVar8 = bVar8 + 5;
        uVar10 = uVar10 + 1;
      } while (uVar17 != uVar10);
      return uVar16;
    }
    return 0x40000000;
  }
LAB_003c5d83:
  pcVar2 = (comm->_M_dataplus)._M_p;
  if (uVar17 == 0) {
    comm_00 = (string *)0x60000025;
  }
  else {
    uVar9 = 0x25;
    uVar10 = 0;
    do {
      uVar9 = pcVar2[uVar10] * 0x12ca3 ^ uVar9 * 0xd32b;
      uVar10 = uVar10 + 1;
    } while (uVar17 != uVar10);
    comm_00 = (string *)(ulong)(uVar9 & 0x1fffffff | 0x60000000);
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)local_48,pcVar2,pcVar2 + uVar17);
  addCustomCommodity((units *)local_48,comm_00,code);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return (uint32_t)comm_00;
}

Assistant:

uint32_t getCommodity(std::string comm)
{
    removeEscapeSequences(comm);
    std::transform(comm.begin(), comm.end(), comm.begin(), ::tolower);
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityCodes.empty()) {
            auto fnd2 = customCommodityCodes.find(comm);
            if (fnd2 != customCommodityCodes.end()) {
                return fnd2->second;
            }
        }
    }

    auto fnd = commodities::commodity_codes.find(comm);
    if (fnd != commodities::commodity_codes.end()) {
        return fnd->second;
    }

    if (comm.compare(0, 7, "cxcomm[") == 0) {
        return strtoul(comm.c_str() + 7, nullptr, 0);
    }
    if ((comm.size() < 6) && std::all_of(comm.begin(), comm.end(), [](char x) {
            return (x == ' ' || (x >= '_' && x <= '}'));
        })) {
        std::uint32_t hkey{0x40000000};
        unsigned int shift{0};
        for (auto c : comm) {
            if (c == ' ') {
                c = '_';
            }
            c -= '_';
            hkey += static_cast<std::uint32_t>(c) << shift;
            shift += 5;
        }
        return hkey;
    }
    // generate a hash code for a custom string
    auto hcode = stringHash(comm);
    hcode &= 0x1FFFFFFFU;
    hcode |= 0x60000000U;
    addCustomCommodity(comm, hcode);

    return hcode;
}